

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O1

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
::Video(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::VideoBusHandler,_false>
        *this,VideoBusHandler *bus_handler)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(Cycles),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/Video.hpp:122:22)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Cycles),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Apple/AppleII/Video.hpp:122:22)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  VideoBase::VideoBase(&this->super_VideoBase,false,(function<void_(Cycles)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  this->bus_handler_ = bus_handler;
  return;
}

Assistant:

Video(BusHandler &bus_handler) :
			VideoBase(is_iie, [this] (Cycles cycles) { advance(cycles); }),
			bus_handler_(bus_handler) {}